

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O0

void __thiscall
cmCTestMemCheckHandler::GenerateCTestXML(cmCTestMemCheckHandler *this,cmXMLWriter *xml)

{
  int iVar1;
  cmCTest *pcVar2;
  ulong uVar3;
  cmXMLWriter *pcVar4;
  bool bVar5;
  char *pcVar6;
  size_type sVar7;
  TestResultsVector *pTVar8;
  reference result_00;
  size_type sVar9;
  reference pvVar10;
  reference pvVar11;
  ostream *poVar12;
  void *pvVar13;
  duration<long,_std::ratio<60L,_1L>_> local_cf8;
  rep local_cf0;
  allocator<char> local_ce1;
  string local_ce0;
  allocator<char> local_cb9;
  string local_cb8;
  allocator<char> local_c91;
  string local_c90;
  allocator<char> local_c69;
  string local_c68;
  string local_c48 [32];
  undefined1 local_c28 [8];
  ostringstream cmCTestLog_msg_5;
  allocator<char> local_aa9;
  string local_aa8;
  string local_a88 [32];
  undefined1 local_a68 [8];
  ostringstream cmCTestLog_msg_4;
  string local_8f0 [32];
  undefined1 local_8d0 [8];
  ostringstream cmCTestLog_msg_3;
  undefined1 local_758 [8];
  string output;
  ostringstream local_718 [8];
  ostringstream cmCTestLog_msg_2;
  allocator<char> local_599;
  string local_598;
  string local_578 [32];
  ostringstream local_558 [8];
  ostringstream cmCTestLog_msg_1;
  undefined1 local_3e0 [8];
  string outname;
  int maxTestNameWidth;
  ulong local_398;
  size_type kk;
  int memoryErrors;
  undefined4 local_364;
  undefined1 local_35e;
  allocator<int> local_35d;
  value_type_conflict2 local_35c;
  undefined1 local_358 [2];
  bool res;
  vector<int,_std::allocator<int>_> memcheckresults;
  string memcheckstr;
  cmCTestTestResult *result_1;
  size_t total;
  ostringstream local_2f0 [8];
  ostringstream cmCTestLog_msg;
  string local_178;
  allocator<char> local_151;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 local_110 [8];
  string testPath;
  cmCTestTestResult *result;
  iterator __end1;
  iterator __begin1;
  TestResultsVector *__range1;
  size_type cc;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  cmXMLWriter *local_18;
  cmXMLWriter *xml_local;
  cmCTestMemCheckHandler *this_local;
  
  local_18 = xml;
  xml_local = (cmXMLWriter *)this;
  bVar5 = cmCTest::GetProduceXML((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest)
  ;
  if (bVar5) {
    cmCTest::StartXML((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest,local_18,
                      (bool)((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.AppendXML
                            & 1));
    cmCTest::GenerateSubprojectsOutput
              ((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest,local_18);
    pcVar4 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"DynamicAnalysis",&local_39);
    cmXMLWriter::StartElement(pcVar4,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    switch(this->MemoryTesterStyle) {
    case 1:
      cmXMLWriter::Attribute<char[9]>(local_18,"Checker",(char (*) [9])"Valgrind");
      break;
    case 2:
      cmXMLWriter::Attribute<char[7]>(local_18,"Checker",(char (*) [7])0xd11399);
      break;
    case 3:
      cmXMLWriter::Attribute<char[9]>(local_18,"Checker",(char (*) [9])0xd16a33);
      break;
    case 4:
      cmXMLWriter::Attribute<char[14]>(local_18,"Checker",(char (*) [14])"BoundsChecker");
      break;
    case 5:
      cmXMLWriter::Attribute<char[14]>(local_18,"Checker",(char (*) [14])"CudaSanitizer");
      break;
    case 6:
      cmXMLWriter::Attribute<char[17]>(local_18,"Checker",(char (*) [17])"AddressSanitizer");
      break;
    case 7:
      cmXMLWriter::Attribute<char[14]>(local_18,"Checker",(char (*) [14])"LeakSanitizer");
      break;
    case 8:
      cmXMLWriter::Attribute<char[16]>(local_18,"Checker",(char (*) [16])"ThreadSanitizer");
      break;
    case 9:
      cmXMLWriter::Attribute<char[16]>(local_18,"Checker",(char (*) [16])"MemorySanitizer");
      break;
    case 10:
      cmXMLWriter::Attribute<char[27]>
                (local_18,"Checker",(char (*) [27])"UndefinedBehaviorSanitizer");
      break;
    default:
      cmXMLWriter::Attribute<char[8]>(local_18,"Checker",(char (*) [8])0xd812dd);
    }
    pcVar4 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"StartDateTime",&local_71);
    cmXMLWriter::Element<std::__cxx11::string>
              (pcVar4,&local_70,&(this->super_cmCTestTestHandler).StartTest);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    pcVar4 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"StartTestTime",&local_99);
    cmXMLWriter::
    Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
              (pcVar4,&local_98,&(this->super_cmCTestTestHandler).StartTestTime);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
    pcVar4 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"TestList",(allocator<char> *)((long)&cc + 7));
    cmXMLWriter::StartElement(pcVar4,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&cc + 7));
    pTVar8 = &(this->super_cmCTestTestHandler).TestResults;
    __end1 = std::
             vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
             ::begin(pTVar8);
    result = (cmCTestTestResult *)
             std::
             vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
             ::end(pTVar8);
    while (bVar5 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<cmCTestTestHandler::cmCTestTestResult_*,_std::vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>_>
                                       *)&result), bVar5) {
      testPath.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<cmCTestTestHandler::cmCTestTestResult_*,_std::vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>_>
           ::operator*(&__end1);
      std::operator+(&local_130,&((reference)testPath.field_2._8_8_)->Path,"/");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                     &local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     testPath.field_2._8_8_);
      std::__cxx11::string::~string((string *)&local_130);
      pcVar4 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"Test",&local_151);
      cmCTest::GetShortPathToFile
                (&local_178,(this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest,
                 (string *)local_110);
      cmXMLWriter::Element<std::__cxx11::string>(pcVar4,&local_150,&local_178);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_150);
      std::allocator<char>::~allocator(&local_151);
      std::__cxx11::string::~string((string *)local_110);
      __gnu_cxx::
      __normal_iterator<cmCTestTestHandler::cmCTestTestResult_*,_std::vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>_>
      ::operator++(&__end1);
    }
    cmXMLWriter::EndElement(local_18);
    std::__cxx11::ostringstream::ostringstream(local_2f0);
    std::operator<<((ostream *)local_2f0,"-- Processing memory checking output:\n");
    pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                 ,0x169,pcVar6,
                 (bool)((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet & 1));
    std::__cxx11::string::~string((string *)&total);
    std::__cxx11::ostringstream::~ostringstream(local_2f0);
    sVar7 = std::
            vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
            ::size(&(this->super_cmCTestTestHandler).TestResults);
    for (__range1 = (TestResultsVector *)0x0;
        pTVar8 = (TestResultsVector *)
                 std::
                 vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                 ::size(&(this->super_cmCTestTestHandler).TestResults), __range1 < pTVar8;
        __range1 = (TestResultsVector *)
                   ((long)&(__range1->
                           super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                           )._M_impl.super__Vector_impl_data._M_start + 1)) {
      result_00 = std::
                  vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                  ::operator[](&(this->super_cmCTestTestHandler).TestResults,(size_type)__range1);
      std::__cxx11::string::string
                ((string *)
                 &memcheckresults.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      sVar9 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->ResultStrings);
      local_35c = 0;
      std::allocator<int>::allocator(&local_35d);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_358,sVar9,&local_35c,&local_35d);
      std::allocator<int>::~allocator(&local_35d);
      local_35e = ProcessMemCheckOutput
                            (this,&result_00->Output,
                             (string *)
                             &memcheckresults.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,
                             (vector<int,_std::allocator<int>_> *)local_358);
      if (((bool)local_35e) && (result_00->Status == 9)) {
        local_364 = 9;
      }
      else {
        cmCTestTestHandler::CleanTestOutput
                  (&this->super_cmCTestTestHandler,
                   (string *)
                   &memcheckresults.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                   (long)(this->super_cmCTestTestHandler).CustomMaximumFailedTestOutputSize,
                   (this->super_cmCTestTestHandler).TestOutputTruncation);
        cmCTestTestHandler::WriteTestResultHeader
                  (&this->super_cmCTestTestHandler,local_18,result_00);
        pcVar4 = local_18;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&memoryErrors,"Results",(allocator<char> *)((long)&kk + 7));
        cmXMLWriter::StartElement(pcVar4,(string *)&memoryErrors);
        std::__cxx11::string::~string((string *)&memoryErrors);
        std::allocator<char>::~allocator((allocator<char> *)((long)&kk + 7));
        kk._0_4_ = 0;
        for (local_398 = 0; uVar3 = local_398,
            sVar9 = std::vector<int,_std::allocator<int>_>::size
                              ((vector<int,_std::allocator<int>_> *)local_358), uVar3 < sVar9;
            local_398 = local_398 + 1) {
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)local_358,local_398);
          pcVar4 = local_18;
          if (*pvVar10 != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&maxTestNameWidth,"Defect",
                       (allocator<char> *)(outname.field_2._M_local_buf + 0xf));
            cmXMLWriter::StartElement(pcVar4,(string *)&maxTestNameWidth);
            std::__cxx11::string::~string((string *)&maxTestNameWidth);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(outname.field_2._M_local_buf + 0xf));
            pcVar4 = local_18;
            pvVar11 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[](&this->ResultStringsLong,local_398);
            cmXMLWriter::Attribute<std::__cxx11::string>(pcVar4,"type",pvVar11);
            pcVar4 = local_18;
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)local_358,local_398);
            cmXMLWriter::Content<int>(pcVar4,pvVar10);
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)local_358,local_398);
            kk._0_4_ = (int)kk + *pvVar10;
            cmXMLWriter::EndElement(local_18);
          }
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)local_358,local_398);
          iVar1 = *pvVar10;
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&this->GlobalResults,local_398);
          *pvVar10 = iVar1 + *pvVar10;
        }
        cmXMLWriter::EndElement(local_18);
        if (0 < (int)kk) {
          outname.field_2._8_4_ =
               cmCTest::GetMaxTestNameWidth
                         ((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_3e0,&result_00->Name," ");
          std::__cxx11::string::resize((ulong)local_3e0,(char)outname.field_2._8_4_ + '\x04');
          std::__cxx11::ostringstream::ostringstream(local_558);
          poVar12 = (ostream *)
                    std::ostream::operator<<
                              (local_558,
                               (ulong)((long)&(__range1->
                                              super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                                              )._M_impl.super__Vector_impl_data._M_start + 1));
          poVar12 = std::operator<<(poVar12,"/");
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,sVar7);
          poVar12 = std::operator<<(poVar12," MemCheck: #");
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,result_00->TestCount);
          poVar12 = std::operator<<(poVar12,": ");
          poVar12 = std::operator<<(poVar12,(string *)local_3e0);
          poVar12 = std::operator<<(poVar12,"   Defects: ");
          pvVar13 = (void *)std::ostream::operator<<(poVar12,(int)kk);
          std::ostream::operator<<(pvVar13,std::endl<char,std::char_traits<char>>);
          pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
          std::__cxx11::ostringstream::str();
          pcVar6 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar2,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                       ,399,pcVar6,
                       (bool)((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet & 1
                             ));
          std::__cxx11::string::~string(local_578);
          std::__cxx11::ostringstream::~ostringstream(local_558);
          std::__cxx11::string::~string((string *)local_3e0);
        }
        pcVar4 = local_18;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_598,"Log",&local_599);
        cmXMLWriter::StartElement(pcVar4,&local_598);
        std::__cxx11::string::~string((string *)&local_598);
        std::allocator<char>::~allocator(&local_599);
        bVar5 = cmCTest::ShouldCompressTestOutput
                          ((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest);
        if (bVar5) {
          cmCTest::CompressString
                    ((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest,
                     (string *)
                     &memcheckresults.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          cmXMLWriter::Attribute<char[5]>(local_18,"compression",(char (*) [5])0xd7d837);
          cmXMLWriter::Attribute<char[7]>(local_18,"encoding",(char (*) [7])"base64");
        }
        cmXMLWriter::Content<std::__cxx11::string>
                  (local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &memcheckresults.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
        cmXMLWriter::EndElement(local_18);
        cmCTestTestHandler::WriteTestResultFooter
                  (&this->super_cmCTestTestHandler,local_18,result_00);
        local_364 = 0;
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_358);
      std::__cxx11::string::~string
                ((string *)
                 &memcheckresults.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    std::__cxx11::ostringstream::ostringstream(local_718);
    poVar12 = std::operator<<((ostream *)local_718,
                              "MemCheck log files can be found here: (<#> corresponds to test number)"
                             );
    std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
    pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                 ,0x1a0,pcVar6,
                 (bool)((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet & 1));
    std::__cxx11::string::~string((string *)(output.field_2._M_local_buf + 8));
    std::__cxx11::ostringstream::~ostringstream(local_718);
    std::__cxx11::string::string((string *)local_758,(string *)&this->MemoryTesterOutputFile);
    cmsys::SystemTools::ReplaceString((string *)local_758,"??","<#>");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8d0);
    poVar12 = std::operator<<((ostream *)local_8d0,(string *)local_758);
    std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
    pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                 ,0x1a4,pcVar6,
                 (bool)((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet & 1));
    std::__cxx11::string::~string(local_8f0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8d0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a68);
    poVar12 = std::operator<<((ostream *)local_a68,"Memory checking results:");
    std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
    pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                 ,0x1a6,pcVar6,
                 (bool)((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet & 1));
    std::__cxx11::string::~string(local_a88);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a68);
    pcVar4 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_aa8,"DefectList",&local_aa9)
    ;
    cmXMLWriter::StartElement(pcVar4,&local_aa8);
    std::__cxx11::string::~string((string *)&local_aa8);
    std::allocator<char>::~allocator(&local_aa9);
    for (__range1 = (TestResultsVector *)0x0;
        pTVar8 = (TestResultsVector *)
                 std::vector<int,_std::allocator<int>_>::size(&this->GlobalResults),
        __range1 < pTVar8;
        __range1 = (TestResultsVector *)
                   ((long)&(__range1->
                           super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                           )._M_impl.super__Vector_impl_data._M_start + 1)) {
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                          (&this->GlobalResults,(size_type)__range1);
      if (*pvVar10 != 0) {
        std::ios_base::width((ios_base *)((long)&std::cerr + *(long *)(std::cerr + -0x18)),0x23);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c28);
        pvVar11 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](&this->ResultStringsLong,(size_type)__range1);
        poVar12 = std::operator<<((ostream *)local_c28,(string *)pvVar11);
        poVar12 = std::operator<<(poVar12," - ");
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                            (&this->GlobalResults,(size_type)__range1);
        pvVar13 = (void *)std::ostream::operator<<(poVar12,*pvVar10);
        std::ostream::operator<<(pvVar13,std::endl<char,std::char_traits<char>>);
        pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::__cxx11::ostringstream::str();
        pcVar6 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                     ,0x1ae,pcVar6,
                     (bool)((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet & 1))
        ;
        std::__cxx11::string::~string(local_c48);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c28);
        pcVar4 = local_18;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_c68,"Defect",&local_c69)
        ;
        cmXMLWriter::StartElement(pcVar4,&local_c68);
        std::__cxx11::string::~string((string *)&local_c68);
        std::allocator<char>::~allocator(&local_c69);
        pcVar4 = local_18;
        pvVar11 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](&this->ResultStringsLong,(size_type)__range1);
        cmXMLWriter::Attribute<std::__cxx11::string>(pcVar4,"Type",pvVar11);
        cmXMLWriter::EndElement(local_18);
      }
    }
    cmXMLWriter::EndElement(local_18);
    pcVar4 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c90,"EndDateTime",&local_c91);
    cmXMLWriter::Element<std::__cxx11::string>
              (pcVar4,&local_c90,&(this->super_cmCTestTestHandler).EndTest);
    std::__cxx11::string::~string((string *)&local_c90);
    std::allocator<char>::~allocator(&local_c91);
    pcVar4 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_cb8,"EndTestTime",&local_cb9);
    cmXMLWriter::
    Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
              (pcVar4,&local_cb8,&(this->super_cmCTestTestHandler).EndTestTime);
    std::__cxx11::string::~string((string *)&local_cb8);
    std::allocator<char>::~allocator(&local_cb9);
    pcVar4 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ce0,"ElapsedMinutes",&local_ce1);
    local_cf8.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<60l,1l>>,double,std::ratio<1l,1l>>
                        (&(this->super_cmCTestTestHandler).ElapsedTestingTime);
    local_cf0 = std::chrono::duration<long,_std::ratio<60L,_1L>_>::count(&local_cf8);
    cmXMLWriter::Element<long>(pcVar4,&local_ce0,&local_cf0);
    std::__cxx11::string::~string((string *)&local_ce0);
    std::allocator<char>::~allocator(&local_ce1);
    cmXMLWriter::EndElement(local_18);
    cmCTest::EndXML((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest,local_18);
    std::__cxx11::string::~string((string *)local_758);
  }
  return;
}

Assistant:

void cmCTestMemCheckHandler::GenerateCTestXML(cmXMLWriter& xml)
{
  if (!this->CTest->GetProduceXML()) {
    return;
  }
  this->CTest->StartXML(xml, this->AppendXML);
  this->CTest->GenerateSubprojectsOutput(xml);
  xml.StartElement("DynamicAnalysis");
  switch (this->MemoryTesterStyle) {
    case cmCTestMemCheckHandler::VALGRIND:
      xml.Attribute("Checker", "Valgrind");
      break;
    case cmCTestMemCheckHandler::DRMEMORY:
      xml.Attribute("Checker", "DrMemory");
      break;
    case cmCTestMemCheckHandler::PURIFY:
      xml.Attribute("Checker", "Purify");
      break;
    case cmCTestMemCheckHandler::BOUNDS_CHECKER:
      xml.Attribute("Checker", "BoundsChecker");
      break;
    case cmCTestMemCheckHandler::CUDA_SANITIZER:
      xml.Attribute("Checker", "CudaSanitizer");
      break;
    case cmCTestMemCheckHandler::ADDRESS_SANITIZER:
      xml.Attribute("Checker", "AddressSanitizer");
      break;
    case cmCTestMemCheckHandler::LEAK_SANITIZER:
      xml.Attribute("Checker", "LeakSanitizer");
      break;
    case cmCTestMemCheckHandler::THREAD_SANITIZER:
      xml.Attribute("Checker", "ThreadSanitizer");
      break;
    case cmCTestMemCheckHandler::MEMORY_SANITIZER:
      xml.Attribute("Checker", "MemorySanitizer");
      break;
    case cmCTestMemCheckHandler::UB_SANITIZER:
      xml.Attribute("Checker", "UndefinedBehaviorSanitizer");
      break;
    default:
      xml.Attribute("Checker", "Unknown");
  }

  xml.Element("StartDateTime", this->StartTest);
  xml.Element("StartTestTime", this->StartTestTime);
  xml.StartElement("TestList");
  cmCTestMemCheckHandler::TestResultsVector::size_type cc;
  for (cmCTestTestResult const& result : this->TestResults) {
    std::string testPath = result.Path + "/" + result.Name;
    xml.Element("Test", this->CTest->GetShortPathToFile(testPath));
  }
  xml.EndElement(); // TestList
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     "-- Processing memory checking output:\n", this->Quiet);
  size_t total = this->TestResults.size();
  for (cc = 0; cc < this->TestResults.size(); cc++) {
    cmCTestTestResult const& result = this->TestResults[cc];
    std::string memcheckstr;
    std::vector<int> memcheckresults(this->ResultStrings.size(), 0);
    bool res =
      this->ProcessMemCheckOutput(result.Output, memcheckstr, memcheckresults);
    if (res && result.Status == cmCTestMemCheckHandler::COMPLETED) {
      continue;
    }
    this->CleanTestOutput(
      memcheckstr,
      static_cast<size_t>(this->CustomMaximumFailedTestOutputSize),
      this->TestOutputTruncation);
    this->WriteTestResultHeader(xml, result);
    xml.StartElement("Results");
    int memoryErrors = 0;
    for (std::vector<int>::size_type kk = 0; kk < memcheckresults.size();
         ++kk) {
      if (memcheckresults[kk]) {
        xml.StartElement("Defect");
        xml.Attribute("type", this->ResultStringsLong[kk]);
        xml.Content(memcheckresults[kk]);
        memoryErrors += memcheckresults[kk];
        xml.EndElement(); // Defect
      }
      this->GlobalResults[kk] += memcheckresults[kk];
    }
    xml.EndElement(); // Results
    if (memoryErrors > 0) {
      const int maxTestNameWidth = this->CTest->GetMaxTestNameWidth();
      std::string outname = result.Name + " ";
      outname.resize(maxTestNameWidth + 4, '.');
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         cc + 1 << "/" << total << " MemCheck: #"
                                << result.TestCount << ": " << outname
                                << "   Defects: " << memoryErrors << std::endl,
                         this->Quiet);
    }
    xml.StartElement("Log");
    if (this->CTest->ShouldCompressTestOutput()) {
      this->CTest->CompressString(memcheckstr);
      xml.Attribute("compression", "gzip");
      xml.Attribute("encoding", "base64");
    }
    xml.Content(memcheckstr);
    xml.EndElement(); // Log

    this->WriteTestResultFooter(xml, result);
  }
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     "MemCheck log files can be found here: "
                     "(<#> corresponds to test number)"
                       << std::endl,
                     this->Quiet);
  std::string output = this->MemoryTesterOutputFile;
  cmSystemTools::ReplaceString(output, "??", "<#>");
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, output << std::endl,
                     this->Quiet);
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     "Memory checking results:" << std::endl, this->Quiet);
  xml.StartElement("DefectList");
  for (cc = 0; cc < this->GlobalResults.size(); cc++) {
    if (this->GlobalResults[cc]) {
      std::cerr.width(35);
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         this->ResultStringsLong[cc]
                           << " - " << this->GlobalResults[cc] << std::endl,
                         this->Quiet);
      xml.StartElement("Defect");
      xml.Attribute("Type", this->ResultStringsLong[cc]);
      xml.EndElement();
    }
  }
  xml.EndElement(); // DefectList

  xml.Element("EndDateTime", this->EndTest);
  xml.Element("EndTestTime", this->EndTestTime);
  xml.Element(
    "ElapsedMinutes",
    std::chrono::duration_cast<std::chrono::minutes>(this->ElapsedTestingTime)
      .count());

  xml.EndElement(); // DynamicAnalysis
  this->CTest->EndXML(xml);
}